

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

void deqp::gls::StateQueryUtil::verifyInteger
               (ResultCollector *result,QueriedState *state,int expected)

{
  GLboolean GVar1;
  DataType DVar2;
  deBool dVar3;
  bool *pbVar4;
  GLint *pGVar5;
  GLfloat *pGVar6;
  GLuint *pGVar7;
  ostream *poVar8;
  GLint64 *pGVar9;
  deUint64 *pdVar10;
  Hex<8UL> *value;
  Hex<8UL> *value_00;
  Hex<8UL> *value_01;
  Hex<8UL> *value_02;
  Hex<8UL> *value_03;
  Hex<8UL> *value_04;
  Enum<int,_1UL> EVar11;
  string local_978;
  Hex<8UL> local_958;
  string local_950;
  Hex<8UL> local_930;
  string local_928;
  ostringstream local_908 [8];
  ostringstream buf_4;
  undefined1 local_788 [4];
  GLuint reference_3;
  undefined1 local_768 [8];
  ostringstream buf_3;
  GLfloat refValueMax;
  GLfloat refValueMin;
  Hex<8UL> local_5c8;
  string local_5c0;
  Hex<8UL> local_5a0;
  string local_598;
  ostringstream local_578 [8];
  ostringstream buf_2;
  GLint64 reference_2;
  Hex<8UL> local_3d8;
  string local_3d0;
  Hex<8UL> local_3b0;
  string local_3a8;
  ostringstream local_388 [8];
  ostringstream buf_1;
  undefined1 local_208 [4];
  GLint reference_1;
  GetNameFunc local_1e8;
  int local_1e0;
  Enum<int,_1UL> local_1d8;
  GetNameFunc local_1c8;
  int local_1c0;
  Enum<int,_1UL> local_1b8 [2];
  ostringstream local_198 [8];
  ostringstream buf;
  bool reference;
  int expected_local;
  QueriedState *state_local;
  ResultCollector *result_local;
  
  buf._372_4_ = expected;
  DVar2 = QueriedState::getType(state);
  switch(DVar2) {
  case DATATYPE_BOOLEAN:
    buf._371_1_ = buf._372_4_ != 0;
    pbVar4 = QueriedState::getBoolAccess(state);
    if ((*pbVar4 & 1U) != (buf._371_1_ & 1)) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      poVar8 = std::operator<<((ostream *)local_198,"Expected ");
      GVar1 = mapBoolToGLBoolean((bool)(buf._371_1_ & 1));
      EVar11 = glu::getBooleanStr(GVar1);
      local_1c8 = EVar11.m_getName;
      local_1c0 = EVar11.m_value;
      local_1b8[0].m_getName = local_1c8;
      local_1b8[0].m_value = local_1c0;
      poVar8 = tcu::Format::operator<<(poVar8,local_1b8);
      poVar8 = std::operator<<(poVar8,", got ");
      pbVar4 = QueriedState::getBoolAccess(state);
      GVar1 = mapBoolToGLBoolean((bool)(*pbVar4 & 1));
      EVar11 = glu::getBooleanStr(GVar1);
      local_1e8 = EVar11.m_getName;
      local_1e0 = EVar11.m_value;
      local_1d8.m_getName = local_1e8;
      local_1d8.m_value = local_1e0;
      tcu::Format::operator<<(poVar8,&local_1d8);
      std::__cxx11::ostringstream::str();
      tcu::ResultCollector::fail(result,(string *)local_208);
      std::__cxx11::string::~string((string *)local_208);
      std::__cxx11::ostringstream::~ostringstream(local_198);
    }
    break;
  case DATATYPE_INTEGER:
    buf_1._372_4_ = buf._372_4_;
    pGVar5 = QueriedState::getIntAccess(state);
    if (*pGVar5 != buf_1._372_4_) {
      std::__cxx11::ostringstream::ostringstream(local_388);
      poVar8 = std::operator<<((ostream *)local_388,"Expected ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,buf_1._372_4_);
      poVar8 = std::operator<<(poVar8,"(");
      tcu::Format::Hex<8UL>::Hex(&local_3b0,(long)(int)buf_1._372_4_);
      de::toString<tcu::Format::Hex<8ul>>(&local_3a8,(de *)&local_3b0,value);
      poVar8 = std::operator<<(poVar8,(string *)&local_3a8);
      poVar8 = std::operator<<(poVar8,") , got ");
      pGVar5 = QueriedState::getIntAccess(state);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pGVar5);
      poVar8 = std::operator<<(poVar8,"(");
      pGVar5 = QueriedState::getIntAccess(state);
      tcu::Format::Hex<8UL>::Hex(&local_3d8,(long)*pGVar5);
      de::toString<tcu::Format::Hex<8ul>>(&local_3d0,(de *)&local_3d8,value_00);
      poVar8 = std::operator<<(poVar8,(string *)&local_3d0);
      std::operator<<(poVar8,")");
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::ostringstream::str();
      tcu::ResultCollector::fail(result,(string *)&reference_2);
      std::__cxx11::string::~string((string *)&reference_2);
      std::__cxx11::ostringstream::~ostringstream(local_388);
    }
    break;
  case DATATYPE_INTEGER64:
    buf_2._368_8_ = SEXT48((int)buf._372_4_);
    pGVar9 = QueriedState::getInt64Access(state);
    if (*pGVar9 != buf_2._368_8_) {
      std::__cxx11::ostringstream::ostringstream(local_578);
      poVar8 = std::operator<<((ostream *)local_578,"Expected ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,buf_2._368_8_);
      poVar8 = std::operator<<(poVar8,"(");
      tcu::Format::Hex<8UL>::Hex(&local_5a0,buf_2._368_8_);
      de::toString<tcu::Format::Hex<8ul>>(&local_598,(de *)&local_5a0,value_01);
      poVar8 = std::operator<<(poVar8,(string *)&local_598);
      poVar8 = std::operator<<(poVar8,"), got ");
      pGVar9 = QueriedState::getInt64Access(state);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pGVar9);
      poVar8 = std::operator<<(poVar8,"(");
      pdVar10 = (deUint64 *)QueriedState::getInt64Access(state);
      tcu::Format::Hex<8UL>::Hex(&local_5c8,*pdVar10);
      de::toString<tcu::Format::Hex<8ul>>(&local_5c0,(de *)&local_5c8,value_02);
      poVar8 = std::operator<<(poVar8,(string *)&local_5c0);
      std::operator<<(poVar8,")");
      std::__cxx11::string::~string((string *)&local_5c0);
      std::__cxx11::string::~string((string *)&local_598);
      std::__cxx11::ostringstream::str();
      tcu::ResultCollector::fail(result,(string *)&refValueMax);
      std::__cxx11::string::~string((string *)&refValueMax);
      std::__cxx11::ostringstream::~ostringstream(local_578);
    }
    break;
  case DATATYPE_FLOAT:
    buf_3._372_4_ = deInt32ToFloatRoundToNegInf(buf._372_4_);
    buf_3._368_4_ = deInt32ToFloatRoundToPosInf(buf._372_4_);
    pGVar6 = QueriedState::getFloatAccess(state);
    if (((float)buf_3._372_4_ <= *pGVar6) &&
       (pGVar6 = QueriedState::getFloatAccess(state), *pGVar6 <= (float)buf_3._368_4_)) {
      pGVar6 = QueriedState::getFloatAccess(state);
      dVar3 = deIsNaN((double)*pGVar6);
      if (dVar3 == 0) {
        return;
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_768);
    if (((float)buf_3._372_4_ != (float)buf_3._368_4_) ||
       (NAN((float)buf_3._372_4_) || NAN((float)buf_3._368_4_))) {
      poVar8 = std::operator<<((ostream *)local_768,"Expected in range [");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(float)buf_3._372_4_);
      poVar8 = std::operator<<(poVar8,", ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(float)buf_3._368_4_);
      poVar8 = std::operator<<(poVar8,"], got ");
      pGVar6 = QueriedState::getFloatAccess(state);
      std::ostream::operator<<(poVar8,*pGVar6);
    }
    else {
      poVar8 = std::operator<<((ostream *)local_768,"Expected ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(float)buf_3._372_4_);
      poVar8 = std::operator<<(poVar8,", got ");
      pGVar6 = QueriedState::getFloatAccess(state);
      std::ostream::operator<<(poVar8,*pGVar6);
    }
    std::__cxx11::ostringstream::str();
    tcu::ResultCollector::fail(result,(string *)local_788);
    std::__cxx11::string::~string((string *)local_788);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_768);
    break;
  case DATATYPE_UNSIGNED_INTEGER:
    buf_4._372_4_ = buf._372_4_;
    pGVar7 = QueriedState::getUintAccess(state);
    if (*pGVar7 != buf_4._372_4_) {
      std::__cxx11::ostringstream::ostringstream(local_908);
      poVar8 = std::operator<<((ostream *)local_908,"Expected ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,buf_4._372_4_);
      poVar8 = std::operator<<(poVar8,"(");
      tcu::Format::Hex<8UL>::Hex(&local_930,(ulong)(uint)buf_4._372_4_);
      de::toString<tcu::Format::Hex<8ul>>(&local_928,(de *)&local_930,value_03);
      poVar8 = std::operator<<(poVar8,(string *)&local_928);
      poVar8 = std::operator<<(poVar8,"), got ");
      pGVar9 = QueriedState::getInt64Access(state);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pGVar9);
      poVar8 = std::operator<<(poVar8,"(");
      pdVar10 = (deUint64 *)QueriedState::getInt64Access(state);
      tcu::Format::Hex<8UL>::Hex(&local_958,*pdVar10);
      de::toString<tcu::Format::Hex<8ul>>(&local_950,(de *)&local_958,value_04);
      poVar8 = std::operator<<(poVar8,(string *)&local_950);
      std::operator<<(poVar8,")");
      std::__cxx11::string::~string((string *)&local_950);
      std::__cxx11::string::~string((string *)&local_928);
      std::__cxx11::ostringstream::str();
      tcu::ResultCollector::fail(result,&local_978);
      std::__cxx11::string::~string((string *)&local_978);
      std::__cxx11::ostringstream::~ostringstream(local_908);
    }
  }
  return;
}

Assistant:

void verifyInteger (tcu::ResultCollector& result, QueriedState& state, int expected)
{
	switch (state.getType())
	{
		case DATATYPE_BOOLEAN:
		{
			const bool reference = (expected != 0);
			if (state.getBoolAccess() != reference)
			{
				std::ostringstream buf;
				buf << "Expected " << glu::getBooleanStr(mapBoolToGLBoolean(reference)) << ", got " << glu::getBooleanStr(mapBoolToGLBoolean(state.getBoolAccess()));
				result.fail(buf.str());
			}
			break;
		}

		case DATATYPE_INTEGER:
		{
			const glw::GLint reference = expected;
			if (state.getIntAccess() != reference)
			{
				std::ostringstream buf;
				buf << "Expected " << reference << "(" << de::toString(tcu::Format::Hex<8>(reference))
					<< ") , got " << state.getIntAccess() << "(" << de::toString(tcu::Format::Hex<8>(state.getIntAccess())) << ")";
				result.fail(buf.str());
			}
			break;
		}

		case DATATYPE_INTEGER64:
		{
			const glw::GLint64 reference = (glw::GLint64)expected;
			if (state.getInt64Access() != reference)
			{
				std::ostringstream buf;
				buf << "Expected " << reference << "(" << de::toString(tcu::Format::Hex<8>(reference)) << "), got "
					<< state.getInt64Access() << "(" << de::toString(tcu::Format::Hex<8>(state.getInt64Access())) << ")";
				result.fail(buf.str());
			}
			break;
		}

		case DATATYPE_FLOAT:
		{
			const glw::GLfloat refValueMin = deInt32ToFloatRoundToNegInf(expected);
			const glw::GLfloat refValueMax = deInt32ToFloatRoundToPosInf(expected);

			if (state.getFloatAccess() < refValueMin ||
				state.getFloatAccess() > refValueMax ||
				deIsNaN(state.getFloatAccess()))
			{
				std::ostringstream buf;

				if (refValueMin == refValueMax)
					buf << "Expected " << refValueMin << ", got " << state.getFloatAccess();
				else
					buf << "Expected in range [" << refValueMin << ", " << refValueMax << "], got " << state.getFloatAccess();

				result.fail(buf.str());
			}
			break;
		}

		case DATATYPE_UNSIGNED_INTEGER:
		{
			const glw::GLuint reference = (glw::GLuint)expected;
			if (state.getUintAccess() != reference)
			{
				std::ostringstream buf;
				buf << "Expected " << reference << "(" << de::toString(tcu::Format::Hex<8>(reference)) << "), got "
					<< state.getInt64Access() << "(" << de::toString(tcu::Format::Hex<8>(state.getInt64Access())) << ")";
				result.fail(buf.str());
			}
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}